

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType ValueType::FromTypeId(TypeId typeId,bool useVirtual)

{
  Bits BVar1;
  bool bVar2;
  Bits bits_1;
  Bits bits;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_a;
  bool useVirtual_local;
  TypeId typeId_local;
  
  if (typeId < TypeIds_Limit) {
    if (useVirtual) {
      BVar1 = VirtualTypeIdToBits[typeId];
      bVar2 = operator!(BVar1);
      if (!bVar2) {
        ValueType((ValueType *)&stack0xfffffffffffffff6,BVar1);
        return (ValueType)aStack_a.bits;
      }
    }
    else {
      BVar1 = TypeIdToBits[typeId];
      bVar2 = operator!(BVar1);
      if (!bVar2) {
        ValueType((ValueType *)&stack0xfffffffffffffff6,BVar1);
        return (ValueType)aStack_a;
      }
    }
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)Uninitialized.field_0.field_0;
}

Assistant:

ValueType ValueType::FromTypeId(const Js::TypeId typeId, bool useVirtual)
{
    if(typeId < _countof(TypeIdToBits))
    {
        if (useVirtual)
        {
            const Bits bits = VirtualTypeIdToBits[typeId];
            if (!!bits)
                return bits;
        }
        else
        {
            const Bits bits = TypeIdToBits[typeId];
            if (!!bits)
                return bits;
        }
    }
    return Uninitialized;
}